

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_7::TwoLevelIterator::InitDataBlock(TwoLevelIterator *this)

{
  bool bVar1;
  int iVar2;
  Iterator *pIVar3;
  TwoLevelIterator *in_RDI;
  long in_FS_OFFSET;
  Iterator *iter;
  Slice handle;
  IteratorWrapper *in_stack_ffffffffffffffa8;
  Slice *this_00;
  string *in_stack_ffffffffffffffb0;
  uint7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined1 uVar4;
  Iterator *in_stack_ffffffffffffffc8;
  TwoLevelIterator *this_01;
  Slice *in_stack_ffffffffffffffd8;
  Slice local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  bVar1 = IteratorWrapper::Valid(in_stack_ffffffffffffffa8);
  if (bVar1) {
    local_18 = IteratorWrapper::value
                         ((IteratorWrapper *)
                          CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    pIVar3 = IteratorWrapper::iter(in_stack_ffffffffffffffa8);
    uVar4 = false;
    if (pIVar3 != (Iterator *)0x0) {
      Slice::Slice((Slice *)(ulong)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      iVar2 = Slice::compare(in_stack_ffffffffffffffd8,(Slice *)this_01);
      uVar4 = iVar2 == 0;
    }
    if ((bool)uVar4 == false) {
      pIVar3 = (*in_RDI->block_function_)(in_RDI->arg_,&in_RDI->options_,&local_18);
      this_00 = (Slice *)&in_RDI->data_block_handle_;
      Slice::data(this_00);
      Slice::size(this_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pIVar3,
                 (char *)in_RDI,CONCAT17(uVar4,in_stack_ffffffffffffffb8));
      SetDataIterator(this_01,pIVar3);
    }
  }
  else {
    SetDataIterator(this_01,in_stack_ffffffffffffffc8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TwoLevelIterator::InitDataBlock() {
  if (!index_iter_.Valid()) {
    SetDataIterator(nullptr);
  } else {
    Slice handle = index_iter_.value();
    if (data_iter_.iter() != nullptr &&
        handle.compare(data_block_handle_) == 0) {
      // data_iter_ is already constructed with this iterator, so
      // no need to change anything
    } else {
      Iterator* iter = (*block_function_)(arg_, options_, handle);
      data_block_handle_.assign(handle.data(), handle.size());
      SetDataIterator(iter);
    }
  }
}